

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.hpp
# Opt level: O3

void __thiscall Box::draw(Box *this,mat4 *projection,mat4 *view,vec3 *eye)

{
  PFNGLDRAWELEMENTSPROC p_Var1;
  PFNGLUNIFORM3FVPROC p_Var2;
  PFNGLUNIFORMMATRIX4FVPROC p_Var3;
  GLint GVar4;
  socklen_t __len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  int __fd;
  ulong uVar5;
  long *local_120 [2];
  long local_110 [2];
  long *local_100 [2];
  long local_f0 [2];
  long *local_e0 [2];
  long local_d0 [2];
  undefined1 local_c0 [144];
  
  (*glad_glEnable)(0xbe2);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glEnable)(0xb44);
  (*glad_glCullFace)(0x405);
  gfx::Program::use(&this->program);
  p_Var3 = glad_glUniformMatrix4fv;
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"projection","");
  GVar4 = (*glad_glGetUniformLocation)((this->program).id,(GLchar *)local_e0[0]);
  (*p_Var3)(GVar4,1,'\0',(GLfloat *)projection);
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  p_Var3 = glad_glUniformMatrix4fv;
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"view","");
  GVar4 = (*glad_glGetUniformLocation)((this->program).id,(GLchar *)local_100[0]);
  (*p_Var3)(GVar4,1,'\0',(GLfloat *)view);
  __len = (socklen_t)view;
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  p_Var2 = glad_glUniform3fv;
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"eye","");
  GVar4 = (*glad_glGetUniformLocation)((this->program).id,(GLchar *)local_120[0]);
  __fd = 1;
  (*p_Var2)(GVar4,1,(GLfloat *)eye);
  __addr = extraout_RDX;
  if (local_120[0] != local_110) {
    uVar5 = local_110[0] + 1;
    operator_delete(local_120[0],uVar5);
    __fd = (int)uVar5;
    __addr = extraout_RDX_00;
  }
  gfx::VAO::bind(&this->vao,__fd,__addr,__len);
  p_Var1 = glad_glDrawElements;
  memcpy(local_c0,&DAT_00127140,0x90);
  (*p_Var1)(4,0x24,0x1405,local_c0);
  gfx::VAO::unbind(&this->vao);
  (*glad_glDisable)(0xb44);
  return;
}

Assistant:

void draw(const glm::mat4& projection, const glm::mat4& view, const glm::vec3& eye) {
        glEnable(GL_BLEND);
        glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
        glEnable(GL_CULL_FACE);
        glCullFace(GL_BACK);
        program.use();
        glUniformMatrix4fv(
            program.uniform_loc("projection"), 
            1,                                 // count
            GL_FALSE,                          // transpose
            glm::value_ptr(projection)         // pointer to data
        );
        glUniformMatrix4fv(program.uniform_loc("view"), 1, GL_FALSE, glm::value_ptr(view));
        glUniform3fv(program.uniform_loc("eye"), 1, glm::value_ptr(eye));
        vao.bind();
        glDrawElements(GL_TRIANGLES, 36, GL_UNSIGNED_INT, std::array<uint, 36>{
            0, 3, 2, 2, 1, 0, 0, 5, 4, 4, 3, 0, 0, 1, 6, 6, 5, 0, 5, 6, 7, 7,
            4, 5, 1, 2, 7, 7, 6, 1, 3, 4, 7, 7, 2, 3
        }.data());
        vao.unbind();
        glDisable(GL_CULL_FACE);
    }